

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.h
# Opt level: O2

bool __thiscall lzham::lzcompressor::state_base::operator==(state_base *this,state_base *rhs)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  bool bVar4;
  
  if (this->m_cur_state != rhs->m_cur_state) {
    return false;
  }
  lVar3 = 0;
  do {
    bVar4 = lVar3 == 4;
    if (bVar4) {
      return bVar4;
    }
    puVar1 = this->m_match_hist + lVar3;
    puVar2 = rhs->m_match_hist + lVar3;
    lVar3 = lVar3 + 1;
  } while (*puVar1 == *puVar2);
  return bVar4;
}

Assistant:

inline bool operator== (const state_base &rhs) const
         {
            if (m_cur_state != rhs.m_cur_state)
               return false;
            for (uint i = 0; i < CLZBase::cMatchHistSize; i++)
               if (m_match_hist[i] != rhs.m_match_hist[i])
                  return false;
            return true;
         }